

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_bufferMode_e ZVar1;
  ZSTD_cStreamStage ZVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  size_t err_code;
  size_t sVar6;
  ulong uVar7;
  ZSTD_bufferMode_e ZVar8;
  void *pvVar9;
  void *pvVar10;
  char *dst;
  char *dst_00;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  void *local_68;
  
  sVar6 = 0xffffffffffffffba;
  if (output->pos <= output->size) {
    uVar7 = input->size;
    uVar11 = input->pos;
    sVar6 = 0xffffffffffffffb8;
    if ((uVar11 <= uVar7) && (sVar6 = 0xffffffffffffffd6, endOp < (ZSTD_e_end|ZSTD_e_flush))) {
      if (cctx == (ZSTD_CCtx *)0x0) {
        __assert_fail("cctx != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1843,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      if (cctx->streamStage == zcss_init) {
        sVar6 = (uVar7 - uVar11) + cctx->stableIn_notConsumed;
        if (((endOp == ZSTD_e_continue) && ((cctx->requestedParams).inBufferMode == ZSTD_bm_stable))
           && (sVar6 < 0x20000)) {
          if (cctx->stableIn_notConsumed != 0) {
            if (input->src != (cctx->expectedInBuffer).src) {
              return 0xffffffffffffffce;
            }
            if (uVar11 != (cctx->expectedInBuffer).size) {
              return 0xffffffffffffffce;
            }
          }
          input->pos = uVar7;
          (cctx->expectedInBuffer).pos = uVar7;
          sVar5 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar5;
          cctx->stableIn_notConsumed = sVar6;
          return (ulong)((cctx->requestedParams).format == ZSTD_f_zstd1) * 4 + 2;
        }
        sVar6 = ZSTD_CCtx_init_compressStream2(cctx,endOp,sVar6);
        if (0xffffffffffffff88 < sVar6) {
          return sVar6;
        }
        ZVar8 = (cctx->appliedParams).inBufferMode;
        if (ZVar8 == ZSTD_bm_stable) {
          (cctx->expectedInBuffer).pos = input->pos;
          sVar6 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar6;
        }
        if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
          cctx->expectedOutBufferSize = output->size - output->pos;
        }
      }
      else {
        ZVar8 = (cctx->appliedParams).inBufferMode;
      }
      if (((ZVar8 != ZSTD_bm_stable) ||
          ((sVar6 = 0xffffffffffffffce, (cctx->expectedInBuffer).src == input->src &&
           ((cctx->expectedInBuffer).pos == input->pos)))) &&
         ((ZVar1 = (cctx->appliedParams).outBufferMode, ZVar1 != ZSTD_bm_stable ||
          (sVar6 = 0xffffffffffffffce, cctx->expectedOutBufferSize == output->size - output->pos))))
      {
        pvVar3 = input->src;
        if (pvVar3 == (void *)0x0) {
          local_68 = (void *)0x0;
          pvVar9 = (void *)0x0;
        }
        else {
          local_68 = (void *)(input->size + (long)pvVar3);
          pvVar9 = (void *)(input->pos + (long)pvVar3);
        }
        pvVar4 = output->dst;
        if (pvVar4 == (void *)0x0) {
          pcVar12 = (char *)0x0;
          dst_00 = (char *)0x0;
        }
        else {
          pcVar12 = (char *)(output->size + (long)pvVar4);
          dst_00 = (char *)(output->pos + (long)pvVar4);
        }
        if (ZVar8 == ZSTD_bm_buffered) {
          if (cctx->inBuff == (char *)0x0) {
            __assert_fail("zcs->inBuff != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x16fe,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          if (cctx->inBuffSize == 0) {
            __assert_fail("zcs->inBuffSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x16ff,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
        }
        else if (ZVar8 == ZSTD_bm_stable) {
          uVar7 = cctx->stableIn_notConsumed;
          if (input->pos < uVar7) {
            __assert_fail("input->pos >= zcs->stableIn_notConsumed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x16f8,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          input->pos = input->pos - uVar7;
          pvVar9 = (void *)((long)pvVar9 - uVar7);
          cctx->stableIn_notConsumed = 0;
        }
        if (ZVar1 == ZSTD_bm_buffered) {
          if (cctx->outBuff == (char *)0x0) {
            __assert_fail("zcs->outBuff != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1702,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          if (cctx->outBuffSize == 0) {
            __assert_fail("zcs->outBuffSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1703,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
        }
        uVar7 = input->size;
        if (pvVar3 == (void *)0x0) {
          if (uVar7 != 0) {
            __assert_fail("input->size == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1705,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          uVar7 = 0;
        }
        if (uVar7 < input->pos) {
          __assert_fail("input->pos <= input->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x1706,
                        "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                       );
        }
        uVar7 = output->size;
        if (pvVar4 == (void *)0x0) {
          if (uVar7 != 0) {
            __assert_fail("output->size == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1707,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          uVar7 = 0;
        }
        if (uVar7 < output->pos) {
          __assert_fail("output->pos <= output->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x1708,
                        "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                       );
        }
        do {
          while (ZVar2 = cctx->streamStage, ZVar2 != zcss_load) {
            if (ZVar2 != zcss_flush) {
              if (ZVar2 == zcss_init) {
                return 0xffffffffffffffc2;
              }
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x1796,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
LAB_0068d8af:
            if ((cctx->appliedParams).outBufferMode != ZSTD_bm_buffered) {
              __assert_fail("zcs->appliedParams.outBufferMode == ZSTD_bm_buffered",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x177b,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            sVar6 = cctx->outBuffFlushedSize;
            uVar11 = cctx->outBuffContentSize - sVar6;
            uVar13 = (long)pcVar12 - (long)dst_00;
            uVar7 = uVar11;
            if (uVar13 < uVar11) {
              uVar7 = uVar13;
            }
            if (uVar7 != 0) {
              memcpy(dst_00,cctx->outBuff + sVar6,uVar7);
              sVar6 = cctx->outBuffFlushedSize;
            }
            dst_00 = dst_00 + uVar7;
            cctx->outBuffFlushedSize = sVar6 + uVar7;
            if (uVar13 < uVar11) {
              bVar16 = dst_00 != pcVar12;
              dst_00 = pcVar12;
              pvVar10 = pvVar9;
              if (bVar16) {
                __assert_fail("op==oend",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                              ,0x1786,
                              "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                             );
              }
              goto LAB_0068da15;
            }
            cctx->outBuffContentSize = 0;
            cctx->outBuffFlushedSize = 0;
            if (cctx->frameEnded != 0) goto LAB_0068d94f;
            cctx->streamStage = zcss_load;
          }
          pvVar10 = local_68;
          if (endOp == ZSTD_e_end) {
            sVar6 = (long)local_68 - (long)pvVar9;
            if (sVar6 < 0xff00ff00ff00ff00) {
              uVar7 = (ulong)(0x20000U - (int)sVar6 >> 0xb);
              if (0x1ffff < sVar6) {
                uVar7 = 0;
              }
              uVar7 = uVar7 + (sVar6 >> 8) + sVar6;
              if (uVar7 == 0) goto LAB_0068d5ba;
            }
            else {
LAB_0068d5ba:
              uVar7 = 0xffffffffffffffb8;
            }
            if (((uVar7 <= (ulong)((long)pcVar12 - (long)dst_00)) ||
                ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable)) && (cctx->inBuffPos == 0))
            {
              sVar6 = ZSTD_compressEnd_public(cctx,dst_00,(long)pcVar12 - (long)dst_00,pvVar9,sVar6)
              ;
              if (0xffffffffffffff88 < sVar6) {
                return sVar6;
              }
              dst_00 = dst_00 + sVar6;
              cctx->streamStage = zcss_init;
              cctx->frameEnded = 1;
              cctx->pledgedSrcSizePlusOne = 0;
              goto LAB_0068da15;
            }
          }
          ZVar8 = (cctx->appliedParams).inBufferMode;
          if (ZVar8 == ZSTD_bm_stable) {
            if (endOp == ZSTD_e_flush) {
              if (pvVar9 == local_68) goto LAB_0068da15;
            }
            else if (endOp == ZSTD_e_continue) {
              if (cctx->blockSize <= (ulong)((long)local_68 - (long)pvVar9)) goto LAB_0068d6a7;
              cctx->stableIn_notConsumed = (long)local_68 - (long)pvVar9;
              goto LAB_0068da15;
            }
            sVar6 = (long)pcVar12 - (long)dst_00;
LAB_0068d6b9:
            uVar7 = (long)local_68 - (long)pvVar9;
            if (cctx->blockSize <= (ulong)((long)local_68 - (long)pvVar9)) {
              uVar7 = cctx->blockSize;
            }
            bVar16 = false;
          }
          else {
            if (ZVar8 != ZSTD_bm_buffered) {
              __assert_fail("zcs->appliedParams.inBufferMode == ZSTD_bm_stable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x1734,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            sVar6 = cctx->inBuffPos;
            uVar11 = cctx->inBuffTarget - sVar6;
            uVar7 = (long)local_68 - (long)pvVar9;
            if (uVar11 < (ulong)((long)local_68 - (long)pvVar9)) {
              uVar7 = uVar11;
            }
            if (uVar7 != 0) {
              memcpy(cctx->inBuff + sVar6,pvVar9,uVar7);
              sVar6 = cctx->inBuffPos;
            }
            uVar11 = sVar6 + uVar7;
            cctx->inBuffPos = uVar11;
            pvVar10 = (void *)(uVar7 + (long)pvVar9);
            if (pvVar9 == (void *)0x0) {
              pvVar10 = pvVar9;
            }
            pvVar9 = pvVar10;
            if (endOp == ZSTD_e_flush) {
              if (uVar11 == cctx->inToCompress) goto LAB_0068da15;
            }
            else if ((endOp == ZSTD_e_continue) && (uVar11 < cctx->inBuffTarget)) goto LAB_0068da15;
LAB_0068d6a7:
            sVar6 = (long)pcVar12 - (long)dst_00;
            if ((cctx->appliedParams).inBufferMode != ZSTD_bm_buffered) goto LAB_0068d6b9;
            uVar7 = cctx->inBuffPos - cctx->inToCompress;
            bVar16 = true;
          }
          if (uVar7 < 0xff00ff00ff00ff00) {
            uVar11 = (ulong)(0x20000U - (int)uVar7 >> 0xb);
            if (0x1ffff < uVar7) {
              uVar11 = 0;
            }
            uVar11 = uVar11 + (uVar7 >> 8) + uVar7;
            if (uVar11 == 0) goto LAB_0068d71a;
          }
          else {
LAB_0068d71a:
            uVar11 = 0xffffffffffffffb8;
          }
          dst = dst_00;
          if ((sVar6 < uVar11) && ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
            sVar6 = cctx->outBuffSize;
            dst = cctx->outBuff;
          }
          if (bVar16) {
            bVar14 = endOp == ZSTD_e_end;
            bVar15 = pvVar9 == local_68;
            bVar16 = bVar15 && bVar14;
            if (bVar15 && bVar14) {
              uVar7 = ZSTD_compressEnd_public
                                (cctx,dst,sVar6,cctx->inBuff + cctx->inToCompress,uVar7);
            }
            else {
              uVar7 = ZSTD_compressContinue_internal
                                (cctx,dst,sVar6,cctx->inBuff + cctx->inToCompress,uVar7,1,0);
            }
            if (0xffffffffffffff88 < uVar7) {
              return uVar7;
            }
            cctx->frameEnded = (uint)bVar16;
            sVar6 = cctx->inBuffPos;
            sVar5 = cctx->blockSize;
            uVar11 = sVar5 + sVar6;
            cctx->inBuffTarget = uVar11;
            if (cctx->inBuffSize < uVar11) {
              cctx->inBuffPos = 0;
              cctx->inBuffTarget = sVar5;
              sVar6 = 0;
              uVar11 = sVar5;
            }
            if ((!bVar15 || !bVar14) && cctx->inBuffSize < uVar11) {
              __assert_fail("zcs->inBuffTarget <= zcs->inBuffSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x175e,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            cctx->inToCompress = sVar6;
          }
          else {
            pvVar10 = (void *)(uVar7 + (long)pvVar9);
            bVar16 = pvVar10 == local_68 && endOp == ZSTD_e_end;
            if (pvVar10 == local_68 && endOp == ZSTD_e_end) {
              uVar7 = ZSTD_compressEnd_public(cctx,dst,sVar6,pvVar9,uVar7);
            }
            else {
              uVar7 = ZSTD_compressContinue_internal(cctx,dst,sVar6,pvVar9,uVar7,1,0);
            }
            if (0xffffffffffffff88 < uVar7) {
              return uVar7;
            }
            if (pvVar9 == (void *)0x0) {
              pvVar10 = pvVar9;
            }
            pvVar9 = pvVar10;
            cctx->frameEnded = (uint)bVar16;
            if (pvVar9 != local_68 && bVar16) {
              __assert_fail("ip == iend",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x1769,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
          }
          if (dst != dst_00) {
            cctx->outBuffContentSize = uVar7;
            cctx->outBuffFlushedSize = 0;
            cctx->streamStage = zcss_flush;
            goto LAB_0068d8af;
          }
          dst_00 = dst_00 + uVar7;
        } while (!bVar16);
LAB_0068d94f:
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
        pvVar10 = pvVar9;
LAB_0068da15:
        input->pos = (long)pvVar10 - (long)pvVar3;
        output->pos = (long)dst_00 - (long)pvVar4;
        if ((cctx->frameEnded != 0) ||
           (sVar6 = ZSTD_nextInputSizeHint(cctx), sVar6 < 0xffffffffffffff89)) {
          if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
            (cctx->expectedInBuffer).pos = input->pos;
            sVar6 = input->size;
            (cctx->expectedInBuffer).src = input->src;
            (cctx->expectedInBuffer).size = sVar6;
          }
          if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
            cctx->expectedOutBufferSize = output->size - output->pos;
          }
          sVar6 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
        }
      }
    }
  }
  return sVar6;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}